

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

void __thiscall r_exec::_TPX::inject_hlps(_TPX *this)

{
  bool bVar1;
  _Mem *this_00;
  P *this_01;
  Code *hlp;
  __normal_iterator<const_core::P<r_code::Code>_*,_std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>_>
  local_28;
  P<r_code::Code> *local_20;
  __normal_iterator<const_core::P<r_code::Code>_*,_std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>_>
  local_18;
  const_iterator c;
  _TPX *this_local;
  
  c._M_current = (P<r_code::Code> *)this;
  __gnu_cxx::
  __normal_iterator<const_core::P<r_code::Code>_*,_std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>_>
  ::__normal_iterator(&local_18);
  local_20 = (P<r_code::Code> *)
             std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::begin
                       (&this->csts);
  local_18._M_current = local_20;
  while( true ) {
    local_28._M_current =
         (P<r_code::Code> *)
         std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::end
                   (&this->csts);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    this_00 = _Mem::Get();
    this_01 = (P *)__gnu_cxx::
                   __normal_iterator<const_core::P<r_code::Code>_*,_std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>_>
                   ::operator*(&local_18);
    hlp = core::P::operator_cast_to_Code_(this_01);
    _Mem::pack_hlp(this_00,hlp);
    __gnu_cxx::
    __normal_iterator<const_core::P<r_code::Code>_*,_std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>_>
    ::operator++(&local_18);
  }
  AutoFocusController::inject_hlps((this->super_TPX).auto_focus,&this->csts);
  AutoFocusController::inject_hlps((this->super_TPX).auto_focus,&this->mdls);
  return;
}

Assistant:

void _TPX::inject_hlps() const
{
    std::vector<P<Code> >::const_iterator c;

    for (c = csts.begin(); c != csts.end(); ++c) {
        _Mem::Get()->pack_hlp(*c);
    }

    auto_focus->inject_hlps(csts);
    auto_focus->inject_hlps(mdls);
}